

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qvalidator.cpp
# Opt level: O0

int __thiscall
QRegularExpressionValidator::qt_metacall
          (QRegularExpressionValidator *this,Call _c,int _id,void **_a)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffe8;
  Call in_stack_ffffffffffffffec;
  QMetaType in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QValidator::qt_metacall
                    ((QValidator *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),(int)in_RCX
                     ,in_RDI);
  if (-1 < iVar2) {
    if (in_ESI == 0) {
      if (iVar2 < 2) {
        qt_static_metacall((QObject *)in_stack_fffffffffffffff0.d_ptr,in_stack_ffffffffffffffec,
                           in_stack_ffffffffffffffe8,in_RDI);
      }
      iVar2 = iVar2 + -2;
    }
    if (in_ESI == 7) {
      if (iVar2 < 2) {
        memset(&stack0xfffffffffffffff0,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xfffffffffffffff0);
        *(QMetaTypeInterface **)*in_RCX = in_stack_fffffffffffffff0.d_ptr;
      }
      iVar2 = iVar2 + -2;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall((QObject *)in_stack_fffffffffffffff0.d_ptr,in_stack_ffffffffffffffec,
                         in_stack_ffffffffffffffe8,in_RDI);
      iVar2 = iVar2 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QRegularExpressionValidator::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QValidator::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}